

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef fori_arg(jit_State *J,BCIns *fori,BCReg slot,IRType t,int mode)

{
  uint in_EDX;
  undefined8 in_RSI;
  int mode_00;
  long in_RDI;
  jit_State *unaff_retaddr;
  TRef tr;
  jit_State *in_stack_00000028;
  TRef local_20;
  
  mode_00 = (int)((ulong)in_RSI >> 0x20);
  local_20 = *(TRef *)(*(long *)(in_RDI + 0x80) + (ulong)in_EDX * 4);
  if ((local_20 == 0) &&
     (local_20 = find_kinit(in_stack_00000028,(BCIns *)J,fori._4_4_,(IRType)fori), local_20 == 0)) {
    local_20 = fori_load(unaff_retaddr,(BCReg)((ulong)in_RDI >> 0x20),(IRType)in_RDI,mode_00);
  }
  return local_20;
}

Assistant:

static TRef fori_arg(jit_State *J, const BCIns *fori, BCReg slot,
		     IRType t, int mode)
{
  TRef tr = J->base[slot];
  if (!tr) {
    tr = find_kinit(J, fori, slot, t);
    if (!tr)
      tr = fori_load(J, slot, t, mode);
  }
  return tr;
}